

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::FoldMax
          (Type *result_type,Constant *a,Constant *b,ConstantManager *param_4)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  int64_t iVar7;
  int64_t iVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  Float *this_00;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  Constant *local_b8;
  Constant *local_b0;
  Constant *local_a8;
  Constant *local_a0;
  Constant *local_98;
  Constant *local_90;
  double vb_5;
  double va_5;
  float vb_4;
  float va_4;
  Float *float_type;
  uint64_t vb_3;
  uint64_t va_3;
  int64_t vb_2;
  int64_t va_2;
  uint32_t vb_1;
  uint32_t va_1;
  int32_t vb;
  int32_t va;
  Integer *int_type;
  ConstantManager *param_3_local;
  Constant *b_local;
  Constant *a_local;
  Type *result_type_local;
  Integer *this;
  undefined4 extraout_var_00;
  
  iVar2 = (*result_type->_vptr_Type[10])();
  this = (Integer *)CONCAT44(extraout_var,iVar2);
  if (this == (Integer *)0x0) {
    iVar2 = (*result_type->_vptr_Type[0xc])();
    this_00 = (Float *)CONCAT44(extraout_var_00,iVar2);
    if (this_00 != (Float *)0x0) {
      uVar3 = analysis::Float::width(this_00);
      if (uVar3 == 0x20) {
        fVar11 = analysis::Constant::GetFloat(a);
        fVar12 = analysis::Constant::GetFloat(b);
        local_b0 = b;
        if (fVar12 < fVar11) {
          local_b0 = a;
        }
        return local_b0;
      }
      uVar3 = analysis::Float::width(this_00);
      if (uVar3 == 0x40) {
        dVar13 = analysis::Constant::GetDouble(a);
        dVar14 = analysis::Constant::GetDouble(b);
        local_b8 = b;
        if (dVar14 < dVar13) {
          local_b8 = a;
        }
        return local_b8;
      }
    }
  }
  else {
    uVar3 = analysis::Integer::width(this);
    if (uVar3 == 0x20) {
      bVar1 = analysis::Integer::IsSigned(this);
      if (!bVar1) {
        uVar3 = analysis::Constant::GetU32(a);
        uVar6 = analysis::Constant::GetU32(b);
        local_98 = b;
        if (uVar6 < uVar3) {
          local_98 = a;
        }
        return local_98;
      }
      iVar4 = analysis::Constant::GetS32(a);
      iVar5 = analysis::Constant::GetS32(b);
      local_90 = b;
      if (iVar5 < iVar4) {
        local_90 = a;
      }
      return local_90;
    }
    uVar3 = analysis::Integer::width(this);
    if (uVar3 == 0x40) {
      bVar1 = analysis::Integer::IsSigned(this);
      if (!bVar1) {
        uVar9 = analysis::Constant::GetU64(a);
        uVar10 = analysis::Constant::GetU64(b);
        local_a8 = b;
        if (uVar10 < uVar9) {
          local_a8 = a;
        }
        return local_a8;
      }
      iVar7 = analysis::Constant::GetS64(a);
      iVar8 = analysis::Constant::GetS64(b);
      local_a0 = b;
      if (iVar8 < iVar7) {
        local_a0 = a;
      }
      return local_a0;
    }
  }
  return (Constant *)0x0;
}

Assistant:

const analysis::Constant* FoldMax(const analysis::Type* result_type,
                                  const analysis::Constant* a,
                                  const analysis::Constant* b,
                                  analysis::ConstantManager*) {
  if (const analysis::Integer* int_type = result_type->AsInteger()) {
    if (int_type->width() == 32) {
      if (int_type->IsSigned()) {
        int32_t va = a->GetS32();
        int32_t vb = b->GetS32();
        return (va > vb ? a : b);
      } else {
        uint32_t va = a->GetU32();
        uint32_t vb = b->GetU32();
        return (va > vb ? a : b);
      }
    } else if (int_type->width() == 64) {
      if (int_type->IsSigned()) {
        int64_t va = a->GetS64();
        int64_t vb = b->GetS64();
        return (va > vb ? a : b);
      } else {
        uint64_t va = a->GetU64();
        uint64_t vb = b->GetU64();
        return (va > vb ? a : b);
      }
    }
  } else if (const analysis::Float* float_type = result_type->AsFloat()) {
    if (float_type->width() == 32) {
      float va = a->GetFloat();
      float vb = b->GetFloat();
      return (va > vb ? a : b);
    } else if (float_type->width() == 64) {
      double va = a->GetDouble();
      double vb = b->GetDouble();
      return (va > vb ? a : b);
    }
  }
  return nullptr;
}